

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetTestPropertyCommand.h
# Opt level: O0

void __thiscall cmGetTestPropertyCommand::~cmGetTestPropertyCommand(cmGetTestPropertyCommand *this)

{
  cmGetTestPropertyCommand *this_local;
  
  ~cmGetTestPropertyCommand(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

cmCommand* Clone() override { return new cmGetTestPropertyCommand; }